

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray
          (Extension *this,int number,bool deterministic,uint8 *target)

{
  float fVar1;
  double dVar2;
  FieldType FVar3;
  unsigned_long uVar4;
  MessageLite *value;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int32 iVar8;
  int iVar9;
  LogMessage *pLVar10;
  Type *pTVar11;
  undefined4 extraout_var;
  anon_union_8_21_eb924b1f_for_Extension_0 aVar12;
  Type *pTVar13;
  undefined4 extraout_var_00;
  int *piVar14;
  uint *puVar15;
  ulong *puVar16;
  double *pdVar17;
  unsigned_long *puVar18;
  bool *pbVar19;
  float *pfVar20;
  long *plVar21;
  ulong uVar22;
  undefined4 extraout_var_01;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  byte *pbVar27;
  double *pdVar28;
  int iVar29;
  string *psVar30;
  RepeatedField<unsigned_int> *pRVar31;
  RepeatedField<unsigned_long> *pRVar32;
  RepeatedField<bool> *pRVar33;
  RepeatedField<double> *pRVar34;
  RepeatedField<float> *pRVar35;
  RepeatedField<long> *pRVar36;
  RepeatedField<int> *pRVar37;
  long lVar38;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (this->is_repeated == true) {
    if (this->is_packed != true) {
      FVar3 = this->type;
      if ((byte)(FVar3 - 0x13) < 0xee) {
        LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                   ,0x7d);
        pLVar10 = LogMessage::operator<<
                            (&local_a0,
                             "CHECK failed: type > 0 && type <= FieldDescriptor::MAX_TYPE: ");
        LogFinisher::operator=((LogFinisher *)&local_68,pLVar10);
        LogMessage::~LogMessage(&local_a0);
      }
      switch(FVar3) {
      case '\x01':
        goto switchD_005bd246_caseD_1;
      case '\x02':
        pRVar35 = (this->field_0).repeated_float_value;
        if (pRVar35->current_size_ < 1) {
          return target;
        }
        uVar23 = number * 8 + 5;
        iVar29 = 0;
        do {
          pfVar20 = RepeatedField<float>::Get(pRVar35,iVar29);
          fVar1 = *pfVar20;
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < (uint)(number << 3)) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          *(float *)(target + 1) = fVar1;
          target = target + 5;
          iVar29 = iVar29 + 1;
          pRVar35 = (this->field_0).repeated_float_value;
        } while (iVar29 < pRVar35->current_size_);
        return target;
      case '\x03':
        pRVar36 = (this->field_0).repeated_int64_value;
        if (pRVar36->current_size_ < 1) {
          return target;
        }
        uVar23 = number << 3;
        iVar29 = 0;
        do {
          puVar16 = (ulong *)RepeatedField<long>::Get(pRVar36,iVar29);
          uVar22 = *puVar16;
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < uVar23) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          pbVar27 = target + 1;
          uVar26 = uVar22;
          if (0x7f < uVar22) {
            do {
              *pbVar27 = (byte)uVar22 | 0x80;
              uVar26 = uVar22 >> 7;
              pbVar27 = pbVar27 + 1;
              bVar5 = 0x3fff < uVar22;
              uVar22 = uVar26;
            } while (bVar5);
          }
          *pbVar27 = (byte)uVar26;
          target = pbVar27 + 1;
          iVar29 = iVar29 + 1;
          pRVar36 = (this->field_0).repeated_int64_value;
        } while (iVar29 < pRVar36->current_size_);
        return target;
      case '\x04':
        pRVar32 = (this->field_0).repeated_uint64_value;
        if (pRVar32->current_size_ < 1) {
          return target;
        }
        uVar23 = number << 3;
        iVar29 = 0;
        do {
          puVar18 = RepeatedField<unsigned_long>::Get(pRVar32,iVar29);
          uVar22 = *puVar18;
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < uVar23) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          pbVar27 = target + 1;
          uVar26 = uVar22;
          if (0x7f < uVar22) {
            do {
              *pbVar27 = (byte)uVar22 | 0x80;
              uVar26 = uVar22 >> 7;
              pbVar27 = pbVar27 + 1;
              bVar5 = 0x3fff < uVar22;
              uVar22 = uVar26;
            } while (bVar5);
          }
          *pbVar27 = (byte)uVar26;
          target = pbVar27 + 1;
          iVar29 = iVar29 + 1;
          pRVar32 = (this->field_0).repeated_uint64_value;
        } while (iVar29 < pRVar32->current_size_);
        return target;
      case '\x05':
        pRVar37 = (this->field_0).repeated_int32_value;
        if (pRVar37->current_size_ < 1) {
          return target;
        }
        uVar23 = number << 3;
        iVar29 = 0;
        do {
          puVar15 = (uint *)RepeatedField<int>::Get(pRVar37,iVar29);
          uVar7 = *puVar15;
          uVar22 = (ulong)(int)uVar7;
          uVar24 = uVar23;
          uVar25 = uVar23;
          if (0x7f < uVar23) {
            do {
              *target = (byte)uVar24 | 0x80;
              uVar25 = uVar24 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar24;
              uVar24 = uVar25;
            } while (bVar5);
          }
          *target = (byte)uVar25;
          pbVar27 = target + 1;
          uVar26 = uVar22;
          if (0x7f < uVar7) {
            do {
              *pbVar27 = (byte)uVar22 | 0x80;
              uVar26 = uVar22 >> 7;
              pbVar27 = pbVar27 + 1;
              bVar5 = 0x3fff < uVar22;
              uVar22 = uVar26;
            } while (bVar5);
          }
          *pbVar27 = (byte)uVar26;
          target = pbVar27 + 1;
          iVar29 = iVar29 + 1;
          pRVar37 = (this->field_0).repeated_int32_value;
        } while (iVar29 < pRVar37->current_size_);
        return target;
      case '\x06':
        pRVar32 = (this->field_0).repeated_uint64_value;
        if (pRVar32->current_size_ < 1) {
          return target;
        }
        uVar23 = number * 8 + 1;
        iVar29 = 0;
        do {
          puVar18 = RepeatedField<unsigned_long>::Get(pRVar32,iVar29);
          uVar4 = *puVar18;
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < (uint)(number << 3)) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          *(unsigned_long *)(target + 1) = uVar4;
          target = target + 9;
          iVar29 = iVar29 + 1;
          pRVar32 = (this->field_0).repeated_uint64_value;
        } while (iVar29 < pRVar32->current_size_);
        return target;
      case '\a':
        pRVar31 = (this->field_0).repeated_uint32_value;
        if (pRVar31->current_size_ < 1) {
          return target;
        }
        uVar23 = number * 8 + 5;
        iVar29 = 0;
        do {
          puVar15 = RepeatedField<unsigned_int>::Get(pRVar31,iVar29);
          uVar7 = *puVar15;
          uVar24 = uVar23;
          uVar25 = uVar23;
          if (0x7f < (uint)(number << 3)) {
            do {
              *target = (byte)uVar24 | 0x80;
              uVar25 = uVar24 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar24;
              uVar24 = uVar25;
            } while (bVar5);
          }
          *target = (byte)uVar25;
          *(uint *)(target + 1) = uVar7;
          target = target + 5;
          iVar29 = iVar29 + 1;
          pRVar31 = (this->field_0).repeated_uint32_value;
        } while (iVar29 < pRVar31->current_size_);
        return target;
      case '\b':
        pRVar33 = (this->field_0).repeated_bool_value;
        if (pRVar33->current_size_ < 1) {
          return target;
        }
        uVar23 = number << 3;
        iVar29 = 0;
        do {
          pbVar19 = RepeatedField<bool>::Get(pRVar33,iVar29);
          bVar5 = *pbVar19;
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < uVar23) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar6 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar6);
          }
          *target = (byte)uVar24;
          target[1] = bVar5;
          target = target + 2;
          iVar29 = iVar29 + 1;
          pRVar33 = (this->field_0).repeated_bool_value;
        } while (iVar29 < pRVar33->current_size_);
        return target;
      case '\t':
        psVar30 = (this->field_0).string_value;
        if ((int)psVar30->_M_string_length < 1) {
          return target;
        }
        uVar23 = number * 8 + 2;
        iVar29 = 0;
        do {
          pTVar11 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              ((RepeatedPtrFieldBase *)psVar30,iVar29);
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < (uint)(number << 3)) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          target = io::CodedOutputStream::WriteStringWithSizeToArray(pTVar11,target + 1);
          iVar29 = iVar29 + 1;
          psVar30 = (this->field_0).string_value;
        } while (iVar29 < (int)psVar30->_M_string_length);
        return target;
      case '\n':
        psVar30 = (this->field_0).string_value;
        if ((int)psVar30->_M_string_length < 1) {
          return target;
        }
        uVar23 = number * 8 + 3;
        uVar7 = number * 8 + 4;
        iVar29 = 0;
        do {
          pTVar13 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                              ((RepeatedPtrFieldBase *)psVar30,iVar29);
          uVar24 = uVar23;
          uVar25 = uVar23;
          if (0x7f < (uint)(number << 3)) {
            do {
              *target = (byte)uVar24 | 0x80;
              uVar25 = uVar24 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar24;
              uVar24 = uVar25;
            } while (bVar5);
          }
          *target = (byte)uVar25;
          iVar9 = (*pTVar13->_vptr_MessageLite[0x10])(pTVar13,(ulong)deterministic,target + 1);
          pbVar27 = (byte *)CONCAT44(extraout_var,iVar9);
          uVar24 = uVar7;
          uVar25 = uVar7;
          if (0x7f < (uint)(number << 3)) {
            do {
              *pbVar27 = (byte)uVar24 | 0x80;
              uVar25 = uVar24 >> 7;
              pbVar27 = pbVar27 + 1;
              bVar5 = 0x3fff < uVar24;
              uVar24 = uVar25;
            } while (bVar5);
          }
          *pbVar27 = (byte)uVar25;
          target = pbVar27 + 1;
          iVar29 = iVar29 + 1;
          psVar30 = (this->field_0).string_value;
        } while (iVar29 < (int)psVar30->_M_string_length);
        return target;
      case '\v':
        psVar30 = (this->field_0).string_value;
        if ((int)psVar30->_M_string_length < 1) {
          return target;
        }
        uVar23 = number * 8 + 2;
        iVar29 = 0;
        do {
          pTVar13 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                              ((RepeatedPtrFieldBase *)psVar30,iVar29);
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < (uint)(number << 3)) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          pbVar27 = target + 1;
          uVar7 = (*pTVar13->_vptr_MessageLite[0xf])(pTVar13);
          if (uVar7 < 0x80) {
            uVar22 = (ulong)uVar7;
          }
          else {
            uVar22 = (ulong)uVar7;
            do {
              *pbVar27 = (byte)uVar7 | 0x80;
              uVar22 = uVar22 >> 7;
              pbVar27 = pbVar27 + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = (uint)uVar22;
            } while (bVar5);
          }
          *pbVar27 = (byte)uVar22;
          iVar9 = (*pTVar13->_vptr_MessageLite[0x10])(pTVar13,(ulong)deterministic,pbVar27 + 1);
          target = (uint8 *)CONCAT44(extraout_var_00,iVar9);
          iVar29 = iVar29 + 1;
          psVar30 = (this->field_0).string_value;
        } while (iVar29 < (int)psVar30->_M_string_length);
        return target;
      case '\f':
        psVar30 = (this->field_0).string_value;
        if ((int)psVar30->_M_string_length < 1) {
          return target;
        }
        uVar23 = number * 8 + 2;
        iVar29 = 0;
        do {
          pTVar11 = RepeatedPtrFieldBase::
                    Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                              ((RepeatedPtrFieldBase *)psVar30,iVar29);
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < (uint)(number << 3)) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          target = io::CodedOutputStream::WriteStringWithSizeToArray(pTVar11,target + 1);
          iVar29 = iVar29 + 1;
          psVar30 = (this->field_0).string_value;
        } while (iVar29 < (int)psVar30->_M_string_length);
        return target;
      case '\r':
        pRVar31 = (this->field_0).repeated_uint32_value;
        if (pRVar31->current_size_ < 1) {
          return target;
        }
        uVar23 = number << 3;
        iVar29 = 0;
        do {
          puVar15 = RepeatedField<unsigned_int>::Get(pRVar31,iVar29);
          uVar7 = *puVar15;
          uVar24 = uVar23;
          uVar25 = uVar23;
          if (0x7f < uVar23) {
            do {
              *target = (byte)uVar24 | 0x80;
              uVar25 = uVar24 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar24;
              uVar24 = uVar25;
            } while (bVar5);
          }
          *target = (byte)uVar25;
          pbVar27 = target + 1;
          uVar24 = uVar7;
          if (0x7f < uVar7) {
            do {
              *pbVar27 = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              pbVar27 = pbVar27 + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *pbVar27 = (byte)uVar24;
          target = pbVar27 + 1;
          iVar29 = iVar29 + 1;
          pRVar31 = (this->field_0).repeated_uint32_value;
        } while (iVar29 < pRVar31->current_size_);
        return target;
      case '\x0e':
        pRVar37 = (this->field_0).repeated_int32_value;
        if (pRVar37->current_size_ < 1) {
          return target;
        }
        uVar23 = number << 3;
        iVar29 = 0;
        do {
          puVar15 = (uint *)RepeatedField<int>::Get(pRVar37,iVar29);
          uVar7 = *puVar15;
          uVar22 = (ulong)(int)uVar7;
          uVar24 = uVar23;
          uVar25 = uVar23;
          if (0x7f < uVar23) {
            do {
              *target = (byte)uVar24 | 0x80;
              uVar25 = uVar24 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar24;
              uVar24 = uVar25;
            } while (bVar5);
          }
          *target = (byte)uVar25;
          pbVar27 = target + 1;
          uVar26 = uVar22;
          if (0x7f < uVar7) {
            do {
              *pbVar27 = (byte)uVar22 | 0x80;
              uVar26 = uVar22 >> 7;
              pbVar27 = pbVar27 + 1;
              bVar5 = 0x3fff < uVar22;
              uVar22 = uVar26;
            } while (bVar5);
          }
          *pbVar27 = (byte)uVar26;
          target = pbVar27 + 1;
          iVar29 = iVar29 + 1;
          pRVar37 = (this->field_0).repeated_int32_value;
        } while (iVar29 < pRVar37->current_size_);
        return target;
      case '\x0f':
        pRVar37 = (this->field_0).repeated_int32_value;
        if (pRVar37->current_size_ < 1) {
          return target;
        }
        uVar23 = number * 8 + 5;
        iVar29 = 0;
        do {
          piVar14 = RepeatedField<int>::Get(pRVar37,iVar29);
          iVar9 = *piVar14;
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < (uint)(number << 3)) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          *(int *)(target + 1) = iVar9;
          target = target + 5;
          iVar29 = iVar29 + 1;
          pRVar37 = (this->field_0).repeated_int32_value;
        } while (iVar29 < pRVar37->current_size_);
        return target;
      case '\x10':
        pRVar36 = (this->field_0).repeated_int64_value;
        if (pRVar36->current_size_ < 1) {
          return target;
        }
        uVar23 = number * 8 + 1;
        iVar29 = 0;
        do {
          plVar21 = RepeatedField<long>::Get(pRVar36,iVar29);
          lVar38 = *plVar21;
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < (uint)(number << 3)) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          *(long *)(target + 1) = lVar38;
          target = target + 9;
          iVar29 = iVar29 + 1;
          pRVar36 = (this->field_0).repeated_int64_value;
        } while (iVar29 < pRVar36->current_size_);
        return target;
      case '\x11':
        pRVar37 = (this->field_0).repeated_int32_value;
        if (pRVar37->current_size_ < 1) {
          return target;
        }
        uVar23 = number << 3;
        iVar29 = 0;
        do {
          piVar14 = RepeatedField<int>::Get(pRVar37,iVar29);
          iVar9 = *piVar14;
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < uVar23) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          pbVar27 = target + 1;
          uVar7 = iVar9 >> 0x1f ^ iVar9 * 2;
          uVar24 = uVar7;
          if (0x7f < uVar7) {
            do {
              *pbVar27 = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              pbVar27 = pbVar27 + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *pbVar27 = (byte)uVar24;
          target = pbVar27 + 1;
          iVar29 = iVar29 + 1;
          pRVar37 = (this->field_0).repeated_int32_value;
        } while (iVar29 < pRVar37->current_size_);
        return target;
      case '\x12':
        pRVar36 = (this->field_0).repeated_int64_value;
        if (pRVar36->current_size_ < 1) {
          return target;
        }
        uVar23 = number << 3;
        iVar29 = 0;
        do {
          plVar21 = RepeatedField<long>::Get(pRVar36,iVar29);
          lVar38 = *plVar21;
          uVar7 = uVar23;
          uVar24 = uVar23;
          if (0x7f < uVar23) {
            do {
              *target = (byte)uVar7 | 0x80;
              uVar24 = uVar7 >> 7;
              target = target + 1;
              bVar5 = 0x3fff < uVar7;
              uVar7 = uVar24;
            } while (bVar5);
          }
          *target = (byte)uVar24;
          pbVar27 = target + 1;
          uVar22 = lVar38 >> 0x3f ^ lVar38 * 2;
          uVar26 = uVar22;
          if (0x7f < uVar22) {
            do {
              *pbVar27 = (byte)uVar22 | 0x80;
              uVar26 = uVar22 >> 7;
              pbVar27 = pbVar27 + 1;
              bVar5 = 0x3fff < uVar22;
              uVar22 = uVar26;
            } while (bVar5);
          }
          *pbVar27 = (byte)uVar26;
          target = pbVar27 + 1;
          iVar29 = iVar29 + 1;
          pRVar36 = (this->field_0).repeated_int64_value;
        } while (iVar29 < pRVar36->current_size_);
        return target;
      default:
        return target;
      }
    }
    if (this->cached_size == 0) {
      return target;
    }
    uVar23 = number * 8 + 2;
    uVar7 = uVar23;
    if (0x7f < (uint)(number << 3)) {
      do {
        *target = (byte)uVar23 | 0x80;
        uVar7 = uVar23 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar23;
        uVar23 = uVar7;
      } while (bVar5);
    }
    *target = (byte)uVar7;
    pbVar27 = target + 1;
    uVar26 = (ulong)this->cached_size;
    uVar22 = uVar26;
    if (0x7f < uVar26) {
      do {
        *pbVar27 = (byte)uVar22 | 0x80;
        uVar26 = uVar22 >> 7;
        pbVar27 = pbVar27 + 1;
        bVar5 = 0x3fff < uVar22;
        uVar22 = uVar26;
      } while (bVar5);
    }
    *pbVar27 = (byte)uVar26;
    FVar3 = this->type;
    if ((byte)(FVar3 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x7d);
      pLVar10 = LogMessage::operator<<
                          (&local_a0,"CHECK failed: type > 0 && type <= FieldDescriptor::MAX_TYPE: "
                          );
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar10);
      LogMessage::~LogMessage(&local_a0);
    }
    pdVar28 = (double *)(pbVar27 + 1);
    switch(FVar3) {
    case '\x01':
      goto switchD_005bd362_caseD_1;
    case '\x02':
      pRVar35 = (this->field_0).repeated_float_value;
      if (pRVar35->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        pfVar20 = RepeatedField<float>::Get(pRVar35,iVar29);
        *(float *)pdVar28 = *pfVar20;
        pdVar28 = (double *)((long)pdVar28 + 4);
        iVar29 = iVar29 + 1;
        pRVar35 = (this->field_0).repeated_float_value;
      } while (iVar29 < pRVar35->current_size_);
      return (uint8 *)pdVar28;
    case '\x03':
      pRVar36 = (this->field_0).repeated_int64_value;
      if (pRVar36->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        puVar16 = (ulong *)RepeatedField<long>::Get(pRVar36,iVar29);
        uVar22 = *puVar16;
        uVar26 = uVar22;
        if (0x7f < uVar22) {
          do {
            *(byte *)pdVar28 = (byte)uVar22 | 0x80;
            uVar26 = uVar22 >> 7;
            pdVar28 = (double *)((long)pdVar28 + 1);
            bVar5 = 0x3fff < uVar22;
            uVar22 = uVar26;
          } while (bVar5);
        }
        *(char *)pdVar28 = (char)uVar26;
        pdVar28 = (double *)((long)pdVar28 + 1);
        iVar29 = iVar29 + 1;
        pRVar36 = (this->field_0).repeated_int64_value;
      } while (iVar29 < pRVar36->current_size_);
      return (uint8 *)pdVar28;
    case '\x04':
      pRVar32 = (this->field_0).repeated_uint64_value;
      if (pRVar32->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        puVar18 = RepeatedField<unsigned_long>::Get(pRVar32,iVar29);
        uVar22 = *puVar18;
        uVar26 = uVar22;
        if (0x7f < uVar22) {
          do {
            *(byte *)pdVar28 = (byte)uVar22 | 0x80;
            uVar26 = uVar22 >> 7;
            pdVar28 = (double *)((long)pdVar28 + 1);
            bVar5 = 0x3fff < uVar22;
            uVar22 = uVar26;
          } while (bVar5);
        }
        *(char *)pdVar28 = (char)uVar26;
        pdVar28 = (double *)((long)pdVar28 + 1);
        iVar29 = iVar29 + 1;
        pRVar32 = (this->field_0).repeated_uint64_value;
      } while (iVar29 < pRVar32->current_size_);
      return (uint8 *)pdVar28;
    case '\x05':
      pRVar37 = (this->field_0).repeated_int32_value;
      if (pRVar37->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        piVar14 = RepeatedField<int>::Get(pRVar37,iVar29);
        uVar26 = (ulong)*piVar14;
        uVar22 = uVar26;
        if (0x7f < uVar26) {
          do {
            *(byte *)pdVar28 = (byte)uVar22 | 0x80;
            uVar26 = uVar22 >> 7;
            pdVar28 = (double *)((long)pdVar28 + 1);
            bVar5 = 0x3fff < uVar22;
            uVar22 = uVar26;
          } while (bVar5);
        }
        *(char *)pdVar28 = (char)uVar26;
        pdVar28 = (double *)((long)pdVar28 + 1);
        iVar29 = iVar29 + 1;
        pRVar37 = (this->field_0).repeated_int32_value;
      } while (iVar29 < pRVar37->current_size_);
      return (uint8 *)pdVar28;
    case '\x06':
      pRVar32 = (this->field_0).repeated_uint64_value;
      if (pRVar32->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        pdVar17 = (double *)RepeatedField<unsigned_long>::Get(pRVar32,iVar29);
        *pdVar28 = *pdVar17;
        pdVar28 = pdVar28 + 1;
        iVar29 = iVar29 + 1;
        pRVar32 = (this->field_0).repeated_uint64_value;
      } while (iVar29 < pRVar32->current_size_);
      return (uint8 *)pdVar28;
    case '\a':
      pRVar31 = (this->field_0).repeated_uint32_value;
      if (pRVar31->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        puVar15 = RepeatedField<unsigned_int>::Get(pRVar31,iVar29);
        *(uint *)pdVar28 = *puVar15;
        pdVar28 = (double *)((long)pdVar28 + 4);
        iVar29 = iVar29 + 1;
        pRVar31 = (this->field_0).repeated_uint32_value;
      } while (iVar29 < pRVar31->current_size_);
      return (uint8 *)pdVar28;
    case '\b':
      pRVar33 = (this->field_0).repeated_bool_value;
      if (pRVar33->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      lVar38 = 0;
      do {
        pbVar19 = RepeatedField<bool>::Get(pRVar33,(int)lVar38);
        *(bool *)((long)pdVar28 + lVar38) = *pbVar19;
        pRVar33 = (this->field_0).repeated_bool_value;
        lVar38 = lVar38 + 1;
      } while ((int)lVar38 < pRVar33->current_size_);
      return (uint8 *)((long)pdVar28 + lVar38);
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x1f0);
      pLVar10 = LogMessage::operator<<(&local_68,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=(&local_a1,pLVar10);
      LogMessage::~LogMessage(&local_68);
      return (uint8 *)pdVar28;
    case '\r':
      pRVar31 = (this->field_0).repeated_uint32_value;
      if (pRVar31->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        puVar15 = RepeatedField<unsigned_int>::Get(pRVar31,iVar29);
        uVar23 = *puVar15;
        uVar7 = uVar23;
        if (0x7f < uVar23) {
          do {
            *(byte *)pdVar28 = (byte)uVar23 | 0x80;
            uVar7 = uVar23 >> 7;
            pdVar28 = (double *)((long)pdVar28 + 1);
            bVar5 = 0x3fff < uVar23;
            uVar23 = uVar7;
          } while (bVar5);
        }
        *(char *)pdVar28 = (char)uVar7;
        pdVar28 = (double *)((long)pdVar28 + 1);
        iVar29 = iVar29 + 1;
        pRVar31 = (this->field_0).repeated_uint32_value;
      } while (iVar29 < pRVar31->current_size_);
      return (uint8 *)pdVar28;
    case '\x0e':
      pRVar37 = (this->field_0).repeated_int32_value;
      if (pRVar37->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        piVar14 = RepeatedField<int>::Get(pRVar37,iVar29);
        uVar26 = (ulong)*piVar14;
        uVar22 = uVar26;
        if (0x7f < uVar26) {
          do {
            *(byte *)pdVar28 = (byte)uVar22 | 0x80;
            uVar26 = uVar22 >> 7;
            pdVar28 = (double *)((long)pdVar28 + 1);
            bVar5 = 0x3fff < uVar22;
            uVar22 = uVar26;
          } while (bVar5);
        }
        *(char *)pdVar28 = (char)uVar26;
        pdVar28 = (double *)((long)pdVar28 + 1);
        iVar29 = iVar29 + 1;
        pRVar37 = (this->field_0).repeated_int32_value;
      } while (iVar29 < pRVar37->current_size_);
      return (uint8 *)pdVar28;
    case '\x0f':
      pRVar37 = (this->field_0).repeated_int32_value;
      if (pRVar37->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        piVar14 = RepeatedField<int>::Get(pRVar37,iVar29);
        *(int *)pdVar28 = *piVar14;
        pdVar28 = (double *)((long)pdVar28 + 4);
        iVar29 = iVar29 + 1;
        pRVar37 = (this->field_0).repeated_int32_value;
      } while (iVar29 < pRVar37->current_size_);
      return (uint8 *)pdVar28;
    case '\x10':
      pRVar36 = (this->field_0).repeated_int64_value;
      if (pRVar36->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        pdVar17 = (double *)RepeatedField<long>::Get(pRVar36,iVar29);
        *pdVar28 = *pdVar17;
        pdVar28 = pdVar28 + 1;
        iVar29 = iVar29 + 1;
        pRVar36 = (this->field_0).repeated_int64_value;
      } while (iVar29 < pRVar36->current_size_);
      return (uint8 *)pdVar28;
    case '\x11':
      pRVar37 = (this->field_0).repeated_int32_value;
      if (pRVar37->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        piVar14 = RepeatedField<int>::Get(pRVar37,iVar29);
        uVar23 = *piVar14 >> 0x1f ^ *piVar14 * 2;
        uVar7 = uVar23;
        if (0x7f < uVar23) {
          do {
            *(byte *)pdVar28 = (byte)uVar23 | 0x80;
            uVar7 = uVar23 >> 7;
            pdVar28 = (double *)((long)pdVar28 + 1);
            bVar5 = 0x3fff < uVar23;
            uVar23 = uVar7;
          } while (bVar5);
        }
        *(char *)pdVar28 = (char)uVar7;
        pdVar28 = (double *)((long)pdVar28 + 1);
        iVar29 = iVar29 + 1;
        pRVar37 = (this->field_0).repeated_int32_value;
      } while (iVar29 < pRVar37->current_size_);
      return (uint8 *)pdVar28;
    case '\x12':
      pRVar36 = (this->field_0).repeated_int64_value;
      if (pRVar36->current_size_ < 1) {
        return (uint8 *)pdVar28;
      }
      iVar29 = 0;
      do {
        plVar21 = RepeatedField<long>::Get(pRVar36,iVar29);
        uVar22 = *plVar21 >> 0x3f ^ *plVar21 * 2;
        uVar26 = uVar22;
        if (0x7f < uVar22) {
          do {
            *(byte *)pdVar28 = (byte)uVar22 | 0x80;
            uVar26 = uVar22 >> 7;
            pdVar28 = (double *)((long)pdVar28 + 1);
            bVar5 = 0x3fff < uVar22;
            uVar22 = uVar26;
          } while (bVar5);
        }
        *(char *)pdVar28 = (char)uVar26;
        pdVar28 = (double *)((long)pdVar28 + 1);
        iVar29 = iVar29 + 1;
        pRVar36 = (this->field_0).repeated_int64_value;
      } while (iVar29 < pRVar36->current_size_);
      return (uint8 *)pdVar28;
    default:
      return (uint8 *)pdVar28;
    }
  }
  if ((this->field_0xa & 1) != 0) {
    return target;
  }
  FVar3 = this->type;
  if ((byte)(FVar3 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
               ,0x7d);
    pLVar10 = LogMessage::operator<<
                        (&local_a0,"CHECK failed: type > 0 && type <= FieldDescriptor::MAX_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_68,pLVar10);
    LogMessage::~LogMessage(&local_a0);
  }
  switch(FVar3) {
  case '\x01':
    aVar12 = this->field_0;
    uVar23 = number * 8 + 1;
    uVar7 = uVar23;
    if (0x7f < (uint)(number << 3)) {
      do {
        *target = (byte)uVar23 | 0x80;
        uVar7 = uVar23 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar23;
        uVar23 = uVar7;
      } while (bVar5);
    }
    *target = (byte)uVar7;
    *(anon_union_8_21_eb924b1f_for_Extension_0 *)(target + 1) = aVar12;
    goto LAB_005be353;
  case '\x02':
    iVar8 = (this->field_0).int32_value;
    uVar23 = number * 8 + 5;
    uVar7 = uVar23;
    if (0x7f < (uint)(number << 3)) {
      do {
        *target = (byte)uVar23 | 0x80;
        uVar7 = uVar23 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar23;
        uVar23 = uVar7;
      } while (bVar5);
    }
    *target = (byte)uVar7;
    *(int32 *)(target + 1) = iVar8;
    goto LAB_005be362;
  case '\x03':
    uVar22 = (this->field_0).uint64_value;
    uVar23 = number << 3;
    uVar7 = uVar23;
    if (0x7f < uVar23) {
      do {
        *target = (byte)uVar23 | 0x80;
        uVar7 = uVar23 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar23;
        uVar23 = uVar7;
      } while (bVar5);
    }
    *target = (byte)uVar7;
    pbVar27 = target + 1;
    uVar26 = uVar22;
    if (0x7f < uVar22) {
      do {
        *pbVar27 = (byte)uVar26 | 0x80;
        uVar22 = uVar26 >> 7;
        pbVar27 = pbVar27 + 1;
        bVar5 = 0x3fff < uVar26;
        uVar26 = uVar22;
      } while (bVar5);
    }
    goto LAB_005be335;
  case '\x04':
    uVar22 = (this->field_0).uint64_value;
    uVar23 = number << 3;
    uVar7 = uVar23;
    if (0x7f < uVar23) {
      do {
        *target = (byte)uVar23 | 0x80;
        uVar7 = uVar23 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar23;
        uVar23 = uVar7;
      } while (bVar5);
    }
    *target = (byte)uVar7;
    pbVar27 = target + 1;
    if (0x7f < uVar22) {
      do {
        *pbVar27 = (byte)uVar22 | 0x80;
        uVar26 = uVar22 >> 7;
        pbVar27 = pbVar27 + 1;
        bVar5 = 0x3fff < uVar22;
        uVar22 = uVar26;
      } while (bVar5);
    }
LAB_005be335:
    *pbVar27 = (byte)uVar22;
LAB_005be337:
    target = pbVar27 + 1;
    break;
  case '\x05':
    target = WireFormatLite::WriteInt32ToArray(number,(this->field_0).int32_value,target);
    break;
  case '\x06':
    aVar12 = this->field_0;
    uVar7 = number * 8 + 1;
    uVar23 = uVar7;
    if (0x7f < (uint)(number << 3)) {
      do {
        *target = (byte)uVar7 | 0x80;
        uVar23 = uVar7 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar23;
      } while (bVar5);
    }
    goto LAB_005bdbec;
  case '\a':
    iVar8 = (this->field_0).int32_value;
    uVar7 = number * 8 + 5;
    uVar23 = uVar7;
    if (0x7f < (uint)(number << 3)) {
      do {
        *target = (byte)uVar7 | 0x80;
        uVar23 = uVar7 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar23;
      } while (bVar5);
    }
    goto LAB_005bdd37;
  case '\b':
    bVar5 = (this->field_0).bool_value;
    uVar23 = number << 3;
    uVar7 = uVar23;
    if (0x7f < uVar23) {
      do {
        *target = (byte)uVar23 | 0x80;
        uVar7 = uVar23 >> 7;
        target = target + 1;
        bVar6 = 0x3fff < uVar23;
        uVar23 = uVar7;
      } while (bVar6);
    }
    *target = (byte)uVar7;
    target[1] = bVar5;
    target = target + 2;
    break;
  case '\t':
    target = WireFormatLite::WriteStringToArray(number,(this->field_0).string_value,target);
    break;
  case '\n':
    target = WireFormatLite::WriteGroupToArray(number,(this->field_0).message_value,target);
    break;
  case '\v':
    value = (this->field_0).message_value;
    if ((this->field_0xa & 0x10) == 0) {
      target = WireFormatLite::InternalWriteMessageToArray(number,value,deterministic,target);
    }
    else {
      iVar29 = (*value->_vptr_MessageLite[0x11])
                         (value,(ulong)(uint)number,(ulong)deterministic,target);
      target = (uint8 *)CONCAT44(extraout_var_01,iVar29);
    }
    break;
  case '\f':
    target = WireFormatLite::WriteBytesToArray(number,(this->field_0).string_value,target);
    break;
  case '\r':
    uVar23 = (this->field_0).uint32_value;
    uVar7 = number << 3;
    uVar24 = uVar7;
    if (0x7f < uVar7) {
      do {
        *target = (byte)uVar7 | 0x80;
        uVar24 = uVar7 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar24;
      } while (bVar5);
    }
    *target = (byte)uVar24;
    pbVar27 = target + 1;
    uVar7 = uVar23;
    if (0x7f < uVar23) {
      do {
        *pbVar27 = (byte)uVar23 | 0x80;
        uVar7 = uVar23 >> 7;
        pbVar27 = pbVar27 + 1;
        bVar5 = 0x3fff < uVar23;
        uVar23 = uVar7;
      } while (bVar5);
    }
    *pbVar27 = (byte)uVar7;
    goto LAB_005be337;
  case '\x0e':
    target = WireFormatLite::WriteEnumToArray(number,(this->field_0).enum_value,target);
    break;
  case '\x0f':
    iVar8 = (this->field_0).int32_value;
    uVar23 = number * 8 + 5;
    if (0x7f < (uint)(number << 3)) {
      do {
        *target = (byte)uVar23 | 0x80;
        uVar7 = uVar23 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar23;
        uVar23 = uVar7;
      } while (bVar5);
    }
LAB_005bdd37:
    *target = (byte)uVar23;
    *(int32 *)(target + 1) = iVar8;
LAB_005be362:
    target = target + 5;
    break;
  case '\x10':
    aVar12 = this->field_0;
    uVar23 = number * 8 + 1;
    if (0x7f < (uint)(number << 3)) {
      do {
        *target = (byte)uVar23 | 0x80;
        uVar7 = uVar23 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar23;
        uVar23 = uVar7;
      } while (bVar5);
    }
LAB_005bdbec:
    *target = (byte)uVar23;
    *(anon_union_8_21_eb924b1f_for_Extension_0 *)(target + 1) = aVar12;
LAB_005be353:
    target = target + 9;
    break;
  case '\x11':
    target = WireFormatLite::WriteSInt32ToArray(number,(this->field_0).int32_value,target);
    break;
  case '\x12':
    target = WireFormatLite::WriteSInt64ToArray(number,(this->field_0).int64_value,target);
  }
  return target;
switchD_005bd246_caseD_1:
  pRVar34 = (this->field_0).repeated_double_value;
  if (pRVar34->current_size_ < 1) {
    return target;
  }
  uVar23 = number * 8 + 1;
  iVar29 = 0;
  do {
    pdVar28 = RepeatedField<double>::Get(pRVar34,iVar29);
    dVar2 = *pdVar28;
    uVar7 = uVar23;
    uVar24 = uVar23;
    if (0x7f < (uint)(number << 3)) {
      do {
        *target = (byte)uVar7 | 0x80;
        uVar24 = uVar7 >> 7;
        target = target + 1;
        bVar5 = 0x3fff < uVar7;
        uVar7 = uVar24;
      } while (bVar5);
    }
    *target = (byte)uVar24;
    *(double *)(target + 1) = dVar2;
    target = target + 9;
    iVar29 = iVar29 + 1;
    pRVar34 = (this->field_0).repeated_double_value;
  } while (iVar29 < pRVar34->current_size_);
  return target;
switchD_005bd362_caseD_1:
  pRVar34 = (this->field_0).repeated_double_value;
  if (pRVar34->current_size_ < 1) {
    return (uint8 *)pdVar28;
  }
  iVar29 = 0;
  do {
    pdVar17 = RepeatedField<double>::Get(pRVar34,iVar29);
    *pdVar28 = *pdVar17;
    pdVar28 = pdVar28 + 1;
    iVar29 = iVar29 + 1;
    pRVar34 = (this->field_0).repeated_double_value;
  } while (iVar29 < pRVar34->current_size_);
  return (uint8 *)pdVar28;
}

Assistant:

uint8* ExtensionSet::Extension::InternalSerializeFieldWithCachedSizesToArray(
    int number, bool deterministic, uint8* target) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size == 0) return target;

      target = WireFormatLite::WriteTagToArray(number,
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
      target = WireFormatLite::WriteInt32NoTagToArray(cached_size, target);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case FieldDescriptor::TYPE_##UPPERCASE:                             \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            target = WireFormatLite::Write##CAMELCASE##NoTagToArray(        \
              repeated_##LOWERCASE##_value->Get(i), target);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case FieldDescriptor::TYPE_##UPPERCASE:                             \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            target = WireFormatLite::Write##CAMELCASE##ToArray(number,      \
              repeated_##LOWERCASE##_value->Get(i), target);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case FieldDescriptor::TYPE_##UPPERCASE:                             \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            target = WireFormatLite::InternalWrite##CAMELCASE##ToArray(     \
                      number, repeated_##LOWERCASE##_value->Get(i),         \
                      deterministic, target);                               \
          }                                                                 \
          break

        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                 \
      case FieldDescriptor::TYPE_##UPPERCASE:                    \
        target = WireFormatLite::Write##CAMELCASE##ToArray(      \
            number, VALUE, target); \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE( FIXED32,  Fixed32,   uint32_value);
      HANDLE_TYPE( FIXED64,  Fixed64,   uint64_value);
      HANDLE_TYPE(SFIXED32, SFixed32,    int32_value);
      HANDLE_TYPE(SFIXED64, SFixed64,    int64_value);
      HANDLE_TYPE(   FLOAT,    Float,    float_value);
      HANDLE_TYPE(  DOUBLE,   Double,   double_value);
      HANDLE_TYPE(    BOOL,     Bool,     bool_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case FieldDescriptor::TYPE_MESSAGE:
        if (is_lazy) {
          target = lazymessage_value->InternalWriteMessageToArray(
              number, deterministic, target);
        } else {
          target = WireFormatLite::InternalWriteMessageToArray(
              number, *message_value, deterministic, target);
        }
        break;
    }
  }
  return target;
}